

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O2

ClientRequests * __thiscall
cmFileAPI::BuildClientRequests
          (ClientRequests *__return_storage_ptr__,cmFileAPI *this,Value *requests)

{
  bool bVar1;
  ArrayIndex AVar2;
  Value *request;
  const_iterator cVar3;
  ValueIteratorBase local_80;
  SelfType local_70;
  undefined1 local_60 [48];
  
  (__return_storage_ptr__->
  super_vector<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>).
  super__Vector_base<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>).
  super__Vector_base<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>).
  super__Vector_base<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->Error)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->Error).field_2;
  (__return_storage_ptr__->Error)._M_string_length = 0;
  (__return_storage_ptr__->Error).field_2._M_local_buf[0] = '\0';
  bVar1 = Json::Value::isNull(requests);
  if ((bVar1) || (bVar1 = Json::Value::isArray(requests), !bVar1)) {
    std::__cxx11::string::assign((char *)&__return_storage_ptr__->Error);
  }
  else {
    AVar2 = Json::Value::size(requests);
    std::vector<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>::reserve
              (&__return_storage_ptr__->
                super_vector<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>,
               (ulong)AVar2);
    cVar3 = Json::Value::begin(requests);
    local_80.current_ = cVar3.super_ValueIteratorBase.current_._M_node;
    local_80.isNull_ = cVar3.super_ValueIteratorBase.isNull_;
    cVar3 = Json::Value::end(requests);
    local_70.current_ = cVar3.super_ValueIteratorBase.current_._M_node;
    local_70.isNull_ = cVar3.super_ValueIteratorBase.isNull_;
    while (bVar1 = Json::ValueIteratorBase::operator!=(&local_80,&local_70), bVar1) {
      request = Json::ValueIteratorBase::deref(&local_80);
      BuildClientRequest((ClientRequest *)local_60,this,request);
      std::vector<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>::
      emplace_back<cmFileAPI::ClientRequest>
                (&__return_storage_ptr__->
                  super_vector<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>,
                 (ClientRequest *)local_60);
      std::__cxx11::string::~string((string *)(local_60 + 0x10));
      Json::ValueIteratorBase::increment(&local_80);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

cmFileAPI::ClientRequests cmFileAPI::BuildClientRequests(
  Json::Value const& requests)
{
  ClientRequests result;
  if (requests.isNull()) {
    result.Error = "'requests' member missing";
    return result;
  }
  if (!requests.isArray()) {
    result.Error = "'requests' member is not an array";
    return result;
  }

  result.reserve(requests.size());
  for (Json::Value const& request : requests) {
    result.emplace_back(this->BuildClientRequest(request));
  }

  return result;
}